

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

bool CSOAA::test_ldf_sequence(ldf *data,multi_ex *ec_seq)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  reference ppeVar4;
  reference ppeVar5;
  ostream *this;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long in_RDI;
  example **ec;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  bool isTest;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  byte local_11;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  if (sVar3 == 0) {
    local_11 = 1;
  }
  else {
    in_stack_ffffffffffffffc0 =
         (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> *)
         PTR_test_label_00497f80;
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,0);
    local_11 = (*(code *)in_stack_ffffffffffffffc0)(&(*ppeVar4)->l);
    local_11 = local_11 & 1;
  }
  local_20 = local_10;
  local_28._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppeVar5 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*(&local_28);
    bVar2 = (*(code *)PTR_test_label_00497f80)(&(*ppeVar5)->l);
    if ((bVar2 & 1) != (local_11 & 1)) {
      local_11 = 1;
      this = std::operator<<((ostream *)(*(long *)(local_8 + 0xc0) + 0xe0),
                             "warning: ldf example has mix of train/test data; assuming test");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_28);
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool test_ldf_sequence(ldf& data, multi_ex& ec_seq)
{
  bool isTest;
  if (0 == ec_seq.size())
    isTest = true;
  else
    isTest = COST_SENSITIVE::cs_label.test_label(&ec_seq[0]->l);
  for (const auto & ec : ec_seq)
  {
    // Each sub-example must have just one cost
    assert(ec->l.cs.costs.size() == 1);

    if (COST_SENSITIVE::cs_label.test_label(&ec->l) != isTest)
    {
      isTest = true;
      data.all->trace_message << "warning: ldf example has mix of train/test data; assuming test" << endl;
    }
  }
  return isTest;
}